

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

int match_ldds(MDD *one,MDD *two)

{
  uint8_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  uint uVar5;
  
  uVar2 = *one;
  uVar3 = *two;
  if (uVar3 != 0 && uVar2 != 0) {
    puVar1 = nodes->data;
    puVar4 = (ulong *)(puVar1 + uVar3 * 0x10);
    uVar5 = *(uint *)(puVar1 + uVar3 * 0x10 + 6);
    do {
      while( true ) {
        if (*(uint *)(puVar1 + uVar2 * 0x10 + 6) == uVar5) {
          *one = uVar2;
          *two = uVar3;
          return 1;
        }
        if (*(uint *)(puVar1 + uVar2 * 0x10 + 6) < uVar5) break;
        uVar3 = *puVar4 >> 1 & 0x7fffffffffff;
        if (uVar3 == 0) {
          return 0;
        }
        puVar4 = (ulong *)(puVar1 + uVar3 * 0x10);
        uVar5 = *(uint *)(puVar1 + uVar3 * 0x10 + 6);
      }
      uVar2 = *(ulong *)(puVar1 + uVar2 * 0x10) >> 1 & 0x7fffffffffff;
    } while (uVar2 != 0);
  }
  return 0;
}

Assistant:

static inline int
match_ldds(MDD *one, MDD *two)
{
    MDD m1 = *one, m2 = *two;
    if (m1 == lddmc_false || m2 == lddmc_false) return 0;
    mddnode_t n1 = LDD_GETNODE(m1), n2 = LDD_GETNODE(m2);
    uint32_t v1 = mddnode_getvalue(n1), v2 = mddnode_getvalue(n2);
    while (v1 != v2) {
        if (v1 < v2) {
            m1 = mddnode_getright(n1);
            if (m1 == lddmc_false) return 0;
            n1 = LDD_GETNODE(m1);
            v1 = mddnode_getvalue(n1);
        } else if (v1 > v2) {
            m2 = mddnode_getright(n2);
            if (m2 == lddmc_false) return 0;
            n2 = LDD_GETNODE(m2);
            v2 = mddnode_getvalue(n2);
        }
    }
    *one = m1;
    *two = m2;
    return 1;
}